

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int push_key_share_entry(ptls_buffer_t *buf,uint16_t group,ptls_iovec_t pubkey)

{
  uint8_t *puVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar3 == 0) {
    *(uint16_t *)(buf->base + buf->off) = group << 8 | group >> 8;
    buf->off = buf->off + 2;
    iVar3 = ptls_buffer_reserve_aligned(buf,2,'\0');
    if (iVar3 == 0) {
      puVar1 = buf->base;
      sVar2 = buf->off;
      (puVar1 + sVar2)[0] = '\0';
      (puVar1 + sVar2)[1] = '\0';
      sVar2 = buf->off;
      buf->off = sVar2 + 2;
      iVar3 = ptls_buffer__do_pushv(buf,pubkey.base,pubkey.len);
      if (iVar3 == 0) {
        uVar4 = buf->off - (sVar2 + 2);
        iVar3 = 0x20c;
        if (uVar4 < 0x10000) {
          buf->base[sVar2] = (uint8_t)(uVar4 >> 8);
          buf->base[sVar2 + 1] = (uint8_t)uVar4;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int push_key_share_entry(ptls_buffer_t *buf, uint16_t group, ptls_iovec_t pubkey)
{
    int ret;

    ptls_buffer_push16(buf, group);
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, pubkey.base, pubkey.len); });
    ret = 0;
Exit:
    return ret;
}